

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

int32_t __thiscall icu_63::RegexCompile::buildOp(RegexCompile *this,int32_t type,int32_t val)

{
  uint uVar1;
  
  uVar1 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0xff < (uint)type) {
      error(this,U_REGEX_ERROR_START);
      type = 0;
    }
    if (0xffffff < val) {
      error(this,U_REGEX_ERROR_START);
      val = 0;
    }
    if ((val < 0) &&
       ((((char)type != '\0' && ((type & 0xffU) != 0xff)) || (type = 0xff, (uint)val < 0xff000000)))
       ) {
      error(this,U_REGEX_ERROR_START);
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = type << 0x18 | val;
    }
  }
  return uVar1;
}

Assistant:

int32_t RegexCompile::buildOp(int32_t type, int32_t val) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    if (type < 0 || type > 255) {
        U_ASSERT(FALSE);
        error(U_REGEX_INTERNAL_ERROR);
        type = URX_RESERVED_OP;
    }
    if (val > 0x00ffffff) {
        U_ASSERT(FALSE);
        error(U_REGEX_INTERNAL_ERROR);
        val = 0;
    }
    if (val < 0) {
        if (!(type == URX_RESERVED_OP_N || type == URX_RESERVED_OP)) {
            U_ASSERT(FALSE);
            error(U_REGEX_INTERNAL_ERROR);
            return -1;
        }
        if (URX_TYPE(val) != 0xff) {
            U_ASSERT(FALSE);
            error(U_REGEX_INTERNAL_ERROR);
            return -1;
        }
        type = URX_RESERVED_OP_N;
    }
    return (type << 24) | val;
}